

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O3

size_t duckdb_brotli::BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  BackwardMatch *src2;
  ulong *data;
  long lVar1;
  ulong max_backward_limit;
  uint uVar2;
  size_t gap;
  BrotliEncoderDictionary *dictionary;
  uint32_t *puVar3;
  void *pvVar4;
  PreparedDictionary *pPVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  byte bVar11;
  int iVar12;
  BackwardMatch *dst;
  ZopfliCostModel *self;
  size_t sVar13;
  size_t sVar14;
  undefined8 *puVar15;
  size_t sVar16;
  ulong uVar17;
  size_t sVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  size_t len1;
  uint8_t *puVar31;
  long lVar32;
  ulong *puVar33;
  uint8_t *puVar34;
  ulong uVar35;
  uint8_t *puVar36;
  long lVar37;
  uint8_t *puVar38;
  uint *puVar39;
  ulong uVar40;
  size_t sVar41;
  uint8_t *s1_orig;
  long lVar42;
  ulong uVar43;
  BackwardMatch *pBVar44;
  ulong uVar45;
  ulong uVar46;
  ulong *puVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ulong local_2f0;
  size_t max_backward;
  ulong local_2e0;
  ulong local_2d8;
  size_t max_backward_1;
  size_t total_found;
  ulong local_2a8;
  long local_2a0;
  BackwardMatch *orig_matches;
  undefined8 local_1e8;
  size_t local_1e0;
  uint32_t dict_matches [38];
  StartPosQueue queue;
  
  iVar12 = params->lgwin;
  sVar18 = params->stream_offset;
  uVar20 = 0x145;
  if (params->quality < 0xb) {
    uVar20 = 0x96;
  }
  dst = (BackwardMatch *)BrotliAllocate(m,0xc00);
  lVar22 = 0;
  if (0x7e < num_bytes) {
    lVar22 = num_bytes - 0x7f;
  }
  sVar13 = (params->dictionary).compound.num_chunks;
  gap = (params->dictionary).compound.total_size;
  self = (ZopfliCostModel *)BrotliAllocate(m,0x26a8);
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,self,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(self,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (num_bytes < 4) {
LAB_01d3ab65:
    BrotliFree(m,self->literal_costs_);
    self->literal_costs_ = (float *)0x0;
    BrotliFree(m,self->cost_dist_);
    self->cost_dist_ = (float *)0x0;
    BrotliFree(m,self);
    BrotliFree(m,dst);
    sVar18 = ComputeShortestPathFromNodes(num_bytes,nodes);
    return sVar18;
  }
  max_backward_limit = (1L << ((byte)iVar12 & 0x3f)) - 0x10;
  uVar9 = (ulong)(sVar13 != 0);
  src2 = dst + uVar9 * 0x100;
  sVar13 = 0;
LAB_01d39bec:
  auVar10 = _DAT_01d9fb10;
  uVar30 = sVar13 + position;
  uVar17 = max_backward_limit;
  if (uVar30 < max_backward_limit) {
    uVar17 = uVar30;
  }
  uVar29 = uVar30 + sVar18;
  if (max_backward_limit <= uVar29) {
    uVar29 = max_backward_limit;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    uVar23 = 0;
  }
  else {
    if (uVar30 == 0) {
      bVar19 = 0;
LAB_01d39c59:
      uVar23 = 0;
    }
    else {
      bVar19 = ringbuffer[uVar30 - 1 & ringbuffer_mask];
      if (uVar30 == 1) goto LAB_01d39c59;
      uVar23 = (ulong)ringbuffer[uVar30 - 2 & ringbuffer_mask];
    }
    uVar23 = (ulong)(params->dictionary).contextual.context_map
                    [literal_context_lut[uVar23 + 0x100] | literal_context_lut[bVar19]];
  }
  dictionary = (params->dictionary).contextual.dict[uVar23];
  uVar23 = num_bytes - sVar13;
  uVar24 = uVar30 & ringbuffer_mask;
  uVar25 = 0x10;
  if (params->quality == 0xb) {
    uVar25 = 0x40;
  }
  uVar35 = 0;
  if (uVar25 <= uVar30) {
    uVar35 = uVar30 - uVar25;
  }
  uVar25 = uVar30 - 1;
  uVar43 = 1;
  total_found = (size_t)src2;
  if (uVar35 < uVar25) {
    puVar31 = ringbuffer + uVar24;
LAB_01d39d0a:
    if (uVar30 - uVar25 <= uVar17) {
      if ((*puVar31 == ringbuffer[uVar25 & ringbuffer_mask]) &&
         (puVar34 = ringbuffer + (uVar25 & ringbuffer_mask), puVar31[1] == puVar34[1])) {
        puVar36 = puVar34;
        puVar38 = puVar31;
        uVar40 = uVar23;
        if (7 < uVar23) {
          lVar37 = 0;
LAB_01d39d59:
          if (*(ulong *)(puVar31 + lVar37) == *(ulong *)(puVar34 + lVar37)) goto code_r0x01d39d66;
          uVar45 = *(ulong *)(puVar34 + lVar37) ^ *(ulong *)(puVar31 + lVar37);
          uVar40 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
            }
          }
          uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar37;
          goto LAB_01d39dc1;
        }
        goto LAB_01d39d7b;
      }
      goto LAB_01d39dec;
    }
  }
LAB_01d39dfe:
  if (uVar43 < uVar23) {
    uVar21 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> 0xf;
    uVar25 = (hasher->privat)._H5.bucket_size_;
    puVar3 = (hasher->privat)._H2.buckets_;
    pvVar4 = (hasher->privat)._H40.extra[1];
    uVar40 = (ulong)puVar3[uVar21];
    uVar35 = uVar23;
    if (0x7f < uVar23) {
      puVar3[uVar21] = (uint32_t)uVar30;
      uVar35 = 0x80;
    }
    local_2a8 = (uVar25 & uVar30) * 2 + 1;
    local_2a0 = (uVar25 & uVar30) * 2;
    if (uVar30 != uVar40) {
      lVar37 = 0x40;
      max_backward_1 = 0;
      local_2e0 = 0;
LAB_01d39ea0:
      bVar48 = lVar37 != 0;
      lVar37 = lVar37 + -1;
      if ((uVar30 - uVar40 <= uVar17) && (bVar48)) {
        uVar45 = max_backward_1;
        if (local_2e0 < max_backward_1) {
          uVar45 = local_2e0;
        }
        puVar31 = ringbuffer + uVar45 + uVar24;
        puVar34 = ringbuffer + uVar45 + (uVar40 & ringbuffer_mask);
        uVar46 = uVar23 - uVar45;
        puVar36 = puVar31;
        if (7 < uVar46) {
          lVar32 = 0;
LAB_01d39ef6:
          if (*(ulong *)(puVar34 + lVar32) == *(ulong *)(puVar31 + lVar32)) goto code_r0x01d39f04;
          uVar28 = *(ulong *)(puVar31 + lVar32) ^ *(ulong *)(puVar34 + lVar32);
          uVar46 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          lVar32 = (uVar46 >> 3 & 0x1fffffff) + lVar32;
          goto LAB_01d39f5a;
        }
        goto LAB_01d39f1e;
      }
    }
LAB_01d3a020:
    if (0x7f < uVar23) {
      iVar12 = (hasher->privat)._H5.hash_shift_;
      *(int *)((long)pvVar4 + local_2a0 * 4) = iVar12;
LAB_01d3a03d:
      *(int *)((long)pvVar4 + local_2a8 * 4) = iVar12;
    }
  }
LAB_01d3a089:
  lVar37 = 3;
  auVar49 = _DAT_01d9fb00;
  auVar50 = _DAT_01da0bd0;
  do {
    auVar51 = auVar49 ^ auVar10;
    if (auVar51._4_4_ == -0x80000000 && auVar51._0_4_ < -0x7fffffda) {
      *(undefined4 *)((long)&local_1e8 + lVar37 * 4 + 4) = 0xfffffff;
      dict_matches[lVar37 + -2] = 0xfffffff;
    }
    auVar51 = auVar50 ^ auVar10;
    if (auVar51._4_4_ == -0x80000000 && auVar51._0_4_ < -0x7fffffda) {
      dict_matches[lVar37 + -1] = 0xfffffff;
      dict_matches[lVar37] = 0xfffffff;
    }
    lVar32 = auVar49._8_8_;
    auVar49._0_8_ = auVar49._0_8_ + 4;
    auVar49._8_8_ = lVar32 + 4;
    lVar32 = auVar50._8_8_;
    auVar50._0_8_ = auVar50._0_8_ + 4;
    auVar50._8_8_ = lVar32 + 4;
    lVar37 = lVar37 + 4;
  } while (lVar37 != 0x2b);
  uVar43 = uVar43 + 1;
  if (uVar43 < 5) {
    uVar43 = 4;
  }
  data = (ulong *)(ringbuffer + uVar24);
  iVar12 = BrotliFindAllStaticDictionaryMatches
                     (dictionary,(uint8_t *)data,uVar43,uVar23,dict_matches);
  if (iVar12 != 0) {
    uVar17 = 0x25;
    if (uVar23 < 0x25) {
      uVar17 = uVar23;
    }
    if (uVar43 <= uVar17) {
      iVar12 = (int)uVar43 << 5;
      do {
        uVar21 = dict_matches[uVar43];
        if ((uVar21 < 0xfffffff) &&
           (uVar25 = (ulong)(uVar21 >> 5) + gap + 1 + uVar29, uVar25 <= (params->dist).max_distance)
           ) {
          uVar21 = uVar21 & 0x1f;
          *(int *)total_found = (int)uVar25;
          if (uVar43 == uVar21) {
            uVar21 = 0;
          }
          *(uint *)(total_found + 4) = uVar21 + iVar12;
          total_found = total_found + 8;
        }
        uVar43 = uVar43 + 1;
        iVar12 = iVar12 + 0x20;
      } while (uVar17 + 1 != uVar43);
    }
  }
  sVar14 = (long)(total_found - (long)src2) >> 3;
  local_1e0 = (params->dictionary).compound.num_chunks;
  if (local_1e0 != 0) {
    uVar17 = (params->dist).max_distance;
    sVar16 = (params->dictionary).compound.total_size;
    local_1e8 = *data;
    local_2a8 = 3;
    len1 = 0;
    sVar41 = 0;
LAB_01d3a258:
    pPVar5 = (params->dictionary).compound.chunks[sVar41];
    bVar19 = (byte)pPVar5->bucket_bits;
    bVar11 = (byte)pPVar5->slot_bits;
    bVar7 = -(char)pPVar5->hash_bits;
    uVar25 = ((local_1e8 << (bVar7 & 0x3f)) >> (bVar7 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar19 & 0x3f);
    lVar37 = (1L << (bVar11 & 0x3f)) * 4;
    lVar32 = (1L << (bVar19 & 0x3f)) * 2;
    bVar11 = -bVar11;
    uVar21 = (uint)*(ushort *)((long)&pPVar5[1].magic + (uVar25 & 0xffffffff) * 2 + lVar37);
    puVar15 = (undefined8 *)
              ((long)&pPVar5[1].magic + (ulong)pPVar5->num_items * 4 + lVar32 + lVar37);
    if (pPVar5->magic != 0xdebcede0) {
      puVar15 = (undefined8 *)*puVar15;
    }
    sVar6 = (params->dictionary).compound.chunk_offsets[sVar41];
    pBVar44 = dst + uVar9 * 0x100 + -0x40 + len1;
    uVar2 = pPVar5->source_size;
    puVar39 = (uint *)((long)&pPVar5[1].magic +
                      (ulong)(uVar21 + (&pPVar5[1].magic)
                                       [(uint)((int)uVar25 << (bVar11 & 0x1f)) >> (bVar11 & 0x1f)])
                      * 4 + lVar32 + lVar37);
    uVar21 = (uint)(uVar21 == 0xffff);
    lVar37 = 0;
    uVar25 = local_2a8;
LAB_01d3a32c:
    if (uVar21 == 0) {
LAB_01d3a347:
      uVar21 = *puVar39;
      puVar39 = puVar39 + 1;
      uVar43 = (ulong)(uVar21 & 0x7fffffff);
      uVar21 = uVar21 & 0x80000000;
      uVar40 = ((uVar29 + sVar16) - sVar6) - uVar43;
      uVar35 = uVar2 - uVar43;
      if (uVar23 <= uVar35) {
        uVar35 = uVar23;
      }
      if ((((uVar40 <= uVar17) && (uVar24 + uVar25 <= ringbuffer_mask)) && (uVar25 < uVar35)) &&
         (ringbuffer[uVar24 + uVar25] == *(uint8_t *)((long)puVar15 + uVar43 + uVar25))) {
        puVar33 = (ulong *)(uVar43 + (long)puVar15);
        puVar26 = puVar33;
        puVar47 = data;
        if (7 < uVar35) {
          lVar32 = 0;
          puVar27 = puVar33;
LAB_01d3a3b9:
          if (*puVar47 == *puVar27) goto code_r0x01d3a3c4;
          uVar43 = *puVar27 ^ *puVar47;
          uVar35 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar35 = (uVar35 >> 3 & 0x1fffffff) - lVar32;
          goto LAB_01d3a420;
        }
        goto LAB_01d3a3ed;
      }
      goto LAB_01d3a439;
    }
    goto LAB_01d3a47f;
  }
  goto LAB_01d3a4f1;
code_r0x01d39d66:
  uVar40 = uVar40 - 8;
  lVar37 = lVar37 + 8;
  if (uVar40 < 8) goto code_r0x01d39d74;
  goto LAB_01d39d59;
code_r0x01d39d74:
  puVar36 = puVar34 + lVar37;
  puVar38 = puVar31 + lVar37;
LAB_01d39d7b:
  if (uVar40 != 0) {
    uVar45 = 0;
    do {
      uVar46 = uVar45;
      if (puVar36[uVar45] != puVar38[uVar45]) break;
      uVar45 = uVar45 + 1;
      uVar46 = uVar40;
    } while (uVar40 != uVar45);
    puVar36 = puVar36 + uVar46;
  }
  uVar40 = (long)puVar36 - (long)puVar34;
LAB_01d39dc1:
  if (uVar43 < uVar40) {
    *(int *)total_found = (int)(uVar30 - uVar25);
    *(int *)(total_found + 4) = (int)uVar40 << 5;
    total_found = total_found + 8;
    uVar43 = uVar40;
  }
LAB_01d39dec:
  uVar25 = uVar25 - 1;
  if ((uVar25 <= uVar35) || (2 < uVar43)) goto LAB_01d39dfe;
  goto LAB_01d39d0a;
code_r0x01d39f04:
  uVar46 = uVar46 - 8;
  lVar32 = lVar32 + 8;
  if (uVar46 < 8) goto code_r0x01d39f12;
  goto LAB_01d39ef6;
code_r0x01d39f12:
  puVar34 = puVar34 + lVar32;
  puVar36 = puVar31 + lVar32;
LAB_01d39f1e:
  if (uVar46 != 0) {
    uVar28 = 0;
    do {
      uVar8 = uVar28;
      if (puVar36[uVar28] != puVar34[uVar28]) break;
      uVar28 = uVar28 + 1;
      uVar8 = uVar46;
    } while (uVar46 != uVar28);
    puVar36 = puVar36 + uVar8;
  }
  lVar32 = (long)puVar36 - (long)puVar31;
LAB_01d39f5a:
  uVar45 = lVar32 + uVar45;
  if (total_found == 0) {
    total_found = 0;
  }
  else if (uVar43 < uVar45) {
    *(int *)total_found = (int)(uVar30 - uVar40);
    *(int *)(total_found + 4) = (int)uVar45 << 5;
    total_found = total_found + 8;
    uVar43 = uVar45;
  }
  if (uVar35 <= uVar45) {
    if (uVar23 < 0x80) goto LAB_01d3a089;
    *(undefined4 *)((long)pvVar4 + local_2a0 * 4) =
         *(undefined4 *)((long)pvVar4 + (uVar40 & uVar25) * 8);
    iVar12 = *(int *)((long)pvVar4 + (uVar40 & uVar25) * 8 + 4);
    goto LAB_01d3a03d;
  }
  if (ringbuffer[uVar45 + (uVar40 & ringbuffer_mask)] < ringbuffer[uVar45 + uVar24]) {
    if (0x7f < uVar23) {
      *(int *)((long)pvVar4 + local_2a0 * 4) = (int)uVar40;
    }
    lVar32 = (uVar40 & uVar25) * 2 + 1;
    local_2e0 = uVar45;
    local_2a0 = lVar32;
  }
  else {
    if (0x7f < uVar23) {
      *(int *)((long)pvVar4 + local_2a8 * 4) = (int)uVar40;
    }
    lVar32 = (uVar40 & uVar25) * 2;
    max_backward_1 = uVar45;
    local_2a8 = lVar32;
  }
  uVar40 = (ulong)*(uint *)((long)pvVar4 + lVar32 * 4);
  if (uVar30 == uVar40) goto LAB_01d3a020;
  goto LAB_01d39ea0;
code_r0x01d3a3c4:
  puVar47 = puVar47 + 1;
  puVar27 = puVar27 + 1;
  lVar42 = uVar35 + lVar32;
  lVar32 = lVar32 + -8;
  if (lVar42 - 8U < 8) goto code_r0x01d3a3de;
  goto LAB_01d3a3b9;
code_r0x01d3a3de:
  uVar35 = uVar35 + lVar32;
  puVar26 = puVar27;
  if (uVar35 != 0) {
LAB_01d3a3ed:
    puVar27 = (ulong *)((long)puVar26 + uVar35);
    uVar43 = 0;
    do {
      if (*(uint8_t *)((long)puVar26 + uVar43) != *(uint8_t *)((long)puVar47 + uVar43)) {
        puVar27 = (ulong *)((long)puVar26 + uVar43);
        break;
      }
      uVar43 = uVar43 + 1;
    } while (uVar35 != uVar43);
  }
  uVar35 = (long)puVar27 - (long)puVar33;
LAB_01d3a420:
  if (uVar25 < uVar35) goto LAB_01d3a443;
LAB_01d3a439:
  if (uVar21 != 0) goto LAB_01d3a47f;
  goto LAB_01d3a347;
LAB_01d3a443:
  pBVar44->distance = (uint32_t)uVar40;
  pBVar44->length_and_code = (int)uVar35 << 5;
  pBVar44 = pBVar44 + 1;
  lVar37 = lVar37 + 1;
  uVar25 = uVar35;
  if (lVar37 == 0x40 - len1) goto LAB_01d3a47f;
  goto LAB_01d3a32c;
LAB_01d3a47f:
  len1 = len1 + lVar37;
  if (len1 != 0) {
    if (len1 == 0x40) goto LAB_01d3a4c7;
    local_2a8 = (ulong)(src2[len1 - 0x41].length_and_code >> 5);
  }
  sVar41 = sVar41 + 1;
  if (sVar41 == local_1e0) goto LAB_01d3a4c7;
  goto LAB_01d3a258;
LAB_01d3a4c7:
  MergeMatches(dst,dst + uVar9 * 0x100 + -0x40,len1,src2,sVar14);
  sVar14 = sVar14 + len1;
LAB_01d3a4f1:
  if (sVar14 == 0) {
    sVar14 = 0;
  }
  else if (uVar20 < dst[sVar14 - 1].length_and_code >> 5) {
    *dst = dst[sVar14 - 1];
    sVar14 = 1;
  }
  sVar16 = UpdateNodes(num_bytes,position,sVar13,ringbuffer,ringbuffer_mask,params,
                       max_backward_limit,dist_cache,sVar14,dst,self,&queue,nodes);
  uVar17 = 0;
  if (0x3fff < sVar16) {
    uVar17 = sVar16;
  }
  if (((sVar14 == 1) && (uVar21 = dst->length_and_code >> 5, uVar20 < uVar21)) && (uVar17 < uVar21))
  {
    uVar17 = (ulong)uVar21;
  }
  sVar14 = sVar13;
  if (1 < uVar17) {
    uVar29 = uVar30 + 1;
    uVar23 = uVar17 + uVar30;
    if (lVar22 + position <= uVar17 + uVar30) {
      uVar23 = lVar22 + position;
    }
    uVar24 = uVar23 - 0x3f;
    if (uVar23 < uVar30 + 0x40) {
      uVar24 = uVar29;
    }
    if ((uVar30 + 0x201 <= uVar24) && (uVar29 < uVar24)) {
      uVar30 = (hasher->privat)._H5.bucket_size_;
      puVar3 = (hasher->privat)._H2.buckets_;
      pvVar4 = (hasher->privat)._H40.extra[1];
      do {
        uVar25 = uVar29 & ringbuffer_mask;
        uVar21 = (uint)(*(int *)(ringbuffer + uVar25) * 0x1e35a7bd) >> 0xf;
        uVar35 = (ulong)puVar3[uVar21];
        local_2d8 = (uVar30 & uVar29) * 2 + 1;
        local_2f0 = (uVar30 & uVar29) * 2;
        puVar3[uVar21] = (uint32_t)uVar29;
        if (uVar29 != uVar35) {
          lVar37 = 0x40;
          uVar43 = 0;
          uVar40 = 0;
LAB_01d3a703:
          bVar48 = lVar37 != 0;
          lVar37 = lVar37 + -1;
          if ((uVar29 - uVar35 <= uVar30 - 0xf) && (bVar48)) {
            uVar45 = uVar40;
            if (uVar43 < uVar40) {
              uVar45 = uVar43;
            }
            puVar31 = ringbuffer + uVar45 + uVar25;
            puVar34 = ringbuffer + uVar45 + (uVar35 & ringbuffer_mask);
            uVar46 = 0x80 - uVar45;
            puVar36 = puVar31;
            if (7 < uVar46) {
              lVar42 = 0;
              lVar32 = 0;
LAB_01d3a756:
              if (*(ulong *)(puVar34 + lVar42) == *(ulong *)(puVar31 + lVar42))
              goto code_r0x01d3a763;
              uVar28 = *(ulong *)(puVar31 + lVar42) ^ *(ulong *)(puVar34 + lVar42);
              uVar46 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              lVar32 = (uVar46 >> 3 & 0x1fffffff) - lVar32;
              goto LAB_01d3a7e2;
            }
            goto LAB_01d3a794;
          }
        }
LAB_01d3a83c:
        iVar12 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)pvVar4 + local_2f0 * 4) = iVar12;
LAB_01d3a850:
        *(int *)((long)pvVar4 + local_2d8 * 4) = iVar12;
        uVar29 = uVar29 + 8;
      } while (uVar29 < uVar24);
    }
    if (uVar24 < uVar23) {
      uVar30 = (hasher->privat)._H5.bucket_size_;
      puVar3 = (hasher->privat)._H2.buckets_;
      pvVar4 = (hasher->privat)._H40.extra[1];
      do {
        uVar29 = uVar24 & ringbuffer_mask;
        uVar21 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0xf;
        uVar25 = (ulong)puVar3[uVar21];
        local_2d8 = (uVar30 & uVar24) * 2 + 1;
        local_2f0 = (uVar30 & uVar24) * 2;
        puVar3[uVar21] = (uint32_t)uVar24;
        if (uVar24 != uVar25) {
          lVar37 = 0x40;
          uVar35 = 0;
          uVar43 = 0;
LAB_01d3a929:
          bVar48 = lVar37 != 0;
          lVar37 = lVar37 + -1;
          if ((uVar24 - uVar25 <= uVar30 - 0xf) && (bVar48)) {
            uVar40 = uVar35;
            if (uVar43 < uVar35) {
              uVar40 = uVar43;
            }
            puVar31 = ringbuffer + uVar40 + uVar29;
            puVar34 = ringbuffer + uVar40 + (uVar25 & ringbuffer_mask);
            uVar45 = 0x80 - uVar40;
            puVar36 = puVar31;
            if (7 < uVar45) {
              lVar42 = 0;
              lVar32 = 0;
LAB_01d3a97c:
              if (*(ulong *)(puVar34 + lVar42) == *(ulong *)(puVar31 + lVar42))
              goto code_r0x01d3a989;
              uVar46 = *(ulong *)(puVar31 + lVar42) ^ *(ulong *)(puVar34 + lVar42);
              uVar45 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              lVar32 = (uVar45 >> 3 & 0x1fffffff) - lVar32;
              goto LAB_01d3aa08;
            }
            goto LAB_01d3a9ba;
          }
        }
LAB_01d3aa62:
        iVar12 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)pvVar4 + local_2f0 * 4) = iVar12;
LAB_01d3aa76:
        *(int *)((long)pvVar4 + local_2d8 * 4) = iVar12;
        uVar24 = uVar24 + 1;
      } while (uVar24 < uVar23);
    }
    lVar37 = uVar17 - 1;
    uVar30 = sVar13 + 4;
    do {
      sVar14 = uVar30 - 3;
      if (num_bytes <= uVar30) break;
      EvaluateNode(sVar18 + position,sVar14,max_backward_limit,gap,dist_cache,self,&queue,nodes);
      uVar30 = uVar30 + 1;
      lVar37 = lVar37 + -1;
    } while (lVar37 != 0);
  }
  sVar13 = sVar14 + 1;
  if (num_bytes <= sVar14 + 4) goto LAB_01d3ab65;
  goto LAB_01d39bec;
code_r0x01d3a763:
  lVar42 = lVar42 + 8;
  lVar1 = uVar46 + lVar32;
  lVar32 = lVar32 + -8;
  if (lVar1 - 8U < 8) goto code_r0x01d3a779;
  goto LAB_01d3a756;
code_r0x01d3a779:
  puVar34 = puVar34 + -lVar32;
  uVar46 = uVar46 + lVar32;
  puVar36 = puVar31 + -lVar32;
LAB_01d3a794:
  if (uVar46 != 0) {
    uVar28 = 0;
    do {
      uVar8 = uVar28;
      if (puVar36[uVar28] != puVar34[uVar28]) break;
      uVar28 = uVar28 + 1;
      uVar8 = uVar46;
    } while (uVar46 != uVar28);
    puVar36 = puVar36 + uVar8;
  }
  lVar32 = (long)puVar36 - (long)puVar31;
LAB_01d3a7e2:
  uVar45 = lVar32 + uVar45;
  if (0x7f < uVar45) {
    *(undefined4 *)((long)pvVar4 + local_2f0 * 4) =
         *(undefined4 *)((long)pvVar4 + (uVar35 & uVar30) * 8);
    iVar12 = *(int *)((long)pvVar4 + (uVar35 & uVar30) * 8 + 4);
    goto LAB_01d3a850;
  }
  uVar46 = (uVar35 & uVar30) * 2;
  if (ringbuffer[uVar45 + (uVar35 & ringbuffer_mask)] < ringbuffer[uVar45 + uVar25]) {
    *(int *)((long)pvVar4 + local_2f0 * 4) = (int)uVar35;
    uVar46 = uVar46 | 1;
    uVar43 = uVar45;
    uVar45 = uVar40;
    local_2f0 = uVar46;
  }
  else {
    *(int *)((long)pvVar4 + local_2d8 * 4) = (int)uVar35;
    local_2d8 = uVar46;
  }
  uVar35 = (ulong)*(uint *)((long)pvVar4 + uVar46 * 4);
  uVar40 = uVar45;
  if (uVar29 == uVar35) goto LAB_01d3a83c;
  goto LAB_01d3a703;
code_r0x01d3a989:
  lVar42 = lVar42 + 8;
  lVar1 = uVar45 + lVar32;
  lVar32 = lVar32 + -8;
  if (lVar1 - 8U < 8) goto code_r0x01d3a99f;
  goto LAB_01d3a97c;
code_r0x01d3a99f:
  puVar34 = puVar34 + -lVar32;
  uVar45 = uVar45 + lVar32;
  puVar36 = puVar31 + -lVar32;
LAB_01d3a9ba:
  if (uVar45 != 0) {
    uVar46 = 0;
    do {
      uVar28 = uVar46;
      if (puVar36[uVar46] != puVar34[uVar46]) break;
      uVar46 = uVar46 + 1;
      uVar28 = uVar45;
    } while (uVar45 != uVar46);
    puVar36 = puVar36 + uVar28;
  }
  lVar32 = (long)puVar36 - (long)puVar31;
LAB_01d3aa08:
  uVar40 = lVar32 + uVar40;
  if (0x7f < uVar40) {
    *(undefined4 *)((long)pvVar4 + local_2f0 * 4) =
         *(undefined4 *)((long)pvVar4 + (uVar25 & uVar30) * 8);
    iVar12 = *(int *)((long)pvVar4 + (uVar25 & uVar30) * 8 + 4);
    goto LAB_01d3aa76;
  }
  uVar45 = (uVar25 & uVar30) * 2;
  if (ringbuffer[uVar40 + (uVar25 & ringbuffer_mask)] < ringbuffer[uVar40 + uVar29]) {
    *(int *)((long)pvVar4 + local_2f0 * 4) = (int)uVar25;
    uVar45 = uVar45 | 1;
    uVar43 = uVar40;
    local_2f0 = uVar45;
  }
  else {
    *(int *)((long)pvVar4 + local_2d8 * 4) = (int)uVar25;
    uVar35 = uVar40;
    local_2d8 = uVar45;
  }
  uVar25 = (ulong)*(uint *)((long)pvVar4 + uVar45 * 4);
  if (uVar24 == uVar25) goto LAB_01d3aa62;
  goto LAB_01d3a929;
}

Assistant:

size_t duckdb_brotli::BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  StartPosQueue queue;
  BackwardMatch* BROTLI_RESTRICT matches =
      BROTLI_ALLOC(m, BackwardMatch, 2 * (MAX_NUM_MATCHES_H10 + 64));
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;
  size_t lz_matches_offset =
      (addon->num_chunks != 0) ? (MAX_NUM_MATCHES_H10 + 128) : 0;
  ZopfliCostModel* model = BROTLI_ALLOC(m, ZopfliCostModel, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(model) || BROTLI_IS_NULL(matches)) {
    return 0;
  }
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    int dict_id = 0;
    if (params->dictionary.contextual.context_based) {
      uint8_t p1 = pos >= 1 ?
          ringbuffer[(size_t)(pos - 1) & ringbuffer_mask] : 0;
      uint8_t p2 = pos >= 2 ?
          ringbuffer[(size_t)(pos - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (addon->num_chunks != 0) {
      size_t cd_matches = LookupAllCompoundDictionaryMatches(addon,
          ringbuffer, ringbuffer_mask, pos, 3, num_bytes - i,
          dictionary_start, params->dist.max_distance,
          &matches[lz_matches_offset - 64], 64);
      MergeMatches(matches, &matches[lz_matches_offset - 64], cd_matches,
          &matches[lz_matches_offset], num_matches);
      num_matches += cd_matches;
    }
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, model);
  BROTLI_FREE(m, model);
  BROTLI_FREE(m, matches);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}